

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderVariableManagerGL::StorageBufferBindInfo::SetDynamicOffset
          (StorageBufferBindInfo *this,Uint32 ArrayIndex,Uint32 Offset)

{
  ResourceAttribs *pRVar1;
  PipelineResourceDesc *ResDesc;
  CachedSSBO *pCVar2;
  char (*in_RCX) [109];
  string msg;
  string local_50;
  
  pRVar1 = GetResourceAttribs((this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ParentManager,
                              (this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ResIndex);
  ResDesc = GetResourceDesc((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ParentManager,
                            (this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ResIndex);
  if ((ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV) &&
     (ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[26],char[109]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV"
               ,in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDynamicOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x17d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar2 = ShaderResourceCacheGL::GetConstSSBO
                     ((((this->
                        super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                        ).
                        super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       .m_ParentManager)->
                      super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                      m_ResourceCache,pRVar1->CacheOffset + ArrayIndex);
  VerifyDynamicBufferOffset<Diligent::BufferGLImpl,Diligent::BufferViewGLImpl>
            (ResDesc,(IDeviceObject *)(pCVar2->pBufferView).m_pObject,0,0,(ulong)Offset);
  ShaderResourceCacheGL::SetDynamicSSBOOffset
            ((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
               ).
               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
              .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>
             ).m_ResourceCache,ArrayIndex + pRVar1->CacheOffset,Offset);
  return;
}

Assistant:

void ShaderVariableManagerGL::StorageBufferBindInfo::SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
{
    const auto& Attr = GetAttribs();
    const auto& Desc = GetDesc();
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV ||
                Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV);
#ifdef DILIGENT_DEVELOPMENT
    {
        const auto& CachedSSBO = m_ParentManager.m_ResourceCache.GetConstSSBO(Attr.CacheOffset + ArrayIndex);
        VerifyDynamicBufferOffset<BufferGLImpl, BufferViewGLImpl>(Desc, CachedSSBO.pBufferView, 0, 0, Offset);
    }
#endif

    m_ParentManager.m_ResourceCache.SetDynamicSSBOOffset(Attr.CacheOffset + ArrayIndex, Offset);
}